

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint addChunk_tEXt(ucvector *out,char *keyword,char *textstring)

{
  ulong __n;
  long lVar1;
  uchar *chunk_00;
  uint uVar2;
  uint length;
  ulong uVar3;
  char *orig;
  size_t __n_00;
  ulong uVar4;
  uchar *chunk;
  uchar *local_30;
  
  local_30 = (uchar *)0x0;
  __n = 0xffffffffffffffff;
  do {
    uVar4 = __n;
    __n = uVar4 + 1;
  } while (keyword[uVar4 + 1] != '\0');
  __n_00 = 0xffffffffffffffff;
  uVar3 = __n & 0xffffffff;
  do {
    length = (int)uVar3 + 1;
    uVar3 = (ulong)length;
    lVar1 = __n_00 + 1;
    __n_00 = __n_00 + 1;
  } while (textstring[lVar1] != '\0');
  uVar2 = 0x59;
  if (0xffffffffffffffb0 < uVar4 - 0x4f) {
    uVar2 = lodepng_chunk_init(&local_30,out,length,"tEXt");
    chunk_00 = local_30;
    if (uVar2 == 0) {
      memcpy(local_30 + 8,keyword,__n);
      chunk_00[uVar4 + 9] = '\0';
      if (__n_00 != 0) {
        memcpy(chunk_00 + uVar4 + 10,textstring,__n_00);
      }
      lodepng_chunk_generate_crc(chunk_00);
      uVar2 = 0;
    }
  }
  return uVar2;
}

Assistant:

static unsigned addChunk_tEXt(ucvector* out, const char* keyword, const char* textstring) {
  unsigned char* chunk = 0;
  size_t keysize = lodepng_strlen(keyword), textsize = lodepng_strlen(textstring);
  size_t size = keysize + 1 + textsize;
  if (keysize < 1 || keysize > 79) return 89; /*error: invalid keyword size*/
  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, size, "tEXt"));
  lodepng_memcpy(chunk + 8, keyword, keysize);
  chunk[8 + keysize] = 0; /*null termination char*/
  lodepng_memcpy(chunk + 9 + keysize, textstring, textsize);
  lodepng_chunk_generate_crc(chunk);
  return 0;
}